

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_Initialize
                  (PaAlsaStreamComponent *self,PaAlsaHostApiRepresentation *alsaApi,
                  PaStreamParameters *params,StreamDirection streamDir,int callbackMode)

{
  PaSampleFormat format;
  int iVar1;
  uint uVar2;
  snd_pcm_format_t sVar3;
  PaAlsaDeviceInfo *pPVar4;
  PaSampleFormat availableFormats;
  void **ppvVar5;
  int local_58;
  int local_54;
  int local_50;
  PaAlsaDeviceInfo *devInfo;
  PaSampleFormat hostSampleFormat;
  PaSampleFormat userSampleFormat;
  PaError result;
  int callbackMode_local;
  StreamDirection streamDir_local;
  PaStreamParameters *params_local;
  PaAlsaHostApiRepresentation *alsaApi_local;
  PaAlsaStreamComponent *self_local;
  
  userSampleFormat._4_4_ = 0;
  format = params->sampleFormat;
  devInfo = (PaAlsaDeviceInfo *)0x0;
  if (0 < params->channelCount) {
    memset(self,0,0x80);
    if (params->hostApiSpecificStreamInfo == (void *)0x0) {
      pPVar4 = GetDeviceInfo(&alsaApi->baseHostApiRep,params->device);
      if (streamDir == StreamDirection_In) {
        local_50 = pPVar4->minInputChannels;
      }
      else {
        local_50 = pPVar4->minOutputChannels;
      }
      if (local_50 < params->channelCount) {
        local_54 = params->channelCount;
      }
      else {
        if (streamDir == StreamDirection_In) {
          local_58 = pPVar4->minInputChannels;
        }
        else {
          local_58 = pPVar4->minOutputChannels;
        }
        local_54 = local_58;
      }
      self->numHostChannels = local_54;
      self->deviceIsPlug = pPVar4->isPlug;
    }
    else {
      self->numHostChannels = params->channelCount;
      iVar1 = strncmp("hw:",*(char **)((long)params->hostApiSpecificStreamInfo + 0x18),3);
      if (iVar1 != 0) {
        self->deviceIsPlug = 1;
      }
    }
    if ((self->deviceIsPlug != 0) && (alsaApi->alsaLibVersion < 0x10010)) {
      self->useReventFix = 1;
    }
    self->device = params->device;
    paUtilErr_ = AlsaOpen(&alsaApi->baseHostApiRep,params,streamDir,&self->pcm);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'AlsaOpen( &alsaApi->baseHostApiRep, params, streamDir, &self->pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1902\n"
                       );
      userSampleFormat._4_4_ = paUtilErr_;
    }
    else {
      uVar2 = (*(code *)alsa_snd_pcm_poll_descriptors_count)(self->pcm);
      self->nfds = uVar2;
      availableFormats = GetAvailableFormats(self->pcm);
      devInfo = (PaAlsaDeviceInfo *)PaUtil_SelectClosestAvailableFormat(availableFormats,format);
      paUtilErr_ = (PaError)devInfo;
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'hostSampleFormat = PaUtil_SelectClosestAvailableFormat( GetAvailableFormats( self->pcm ), userSampleFormat )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1905\n"
                         );
        userSampleFormat._4_4_ = paUtilErr_;
      }
      else {
        self->hostSampleFormat = (PaSampleFormat)devInfo;
        sVar3 = Pa2AlsaFormat((PaSampleFormat)devInfo);
        self->nativeFormat = sVar3;
        uVar2 = (uint)(((format & 0x80000000) != 0 ^ 0xffU) & 1);
        self->userInterleaved = uVar2;
        self->hostInterleaved = uVar2;
        self->numUserChannels = params->channelCount;
        self->streamDir = streamDir;
        self->canMmap = 0;
        self->nonMmapBuffer = (void *)0x0;
        self->nonMmapBufferSize = 0;
        if ((callbackMode == 0) && (self->userInterleaved == 0)) {
          ppvVar5 = (void **)PaUtil_AllocateMemory((long)self->numUserChannels << 3);
          self->userBuffers = ppvVar5;
          if (ppvVar5 == (void **)0x0) {
            PaUtil_DebugPrint(
                             "Expression \'self->userBuffers = PaUtil_AllocateMemory( sizeof (void *) * self->numUserChannels )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1920\n"
                             );
            userSampleFormat._4_4_ = -0x2708;
          }
        }
      }
    }
    if (devInfo == (PaAlsaDeviceInfo *)0xffffffffffffd8f6) {
      LogAllAvailableFormats(self->pcm);
    }
    return userSampleFormat._4_4_;
  }
  __assert_fail("params->channelCount > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                ,0x754,
                "PaError PaAlsaStreamComponent_Initialize(PaAlsaStreamComponent *, PaAlsaHostApiRepresentation *, const PaStreamParameters *, StreamDirection, int)"
               );
}

Assistant:

static PaError PaAlsaStreamComponent_Initialize( PaAlsaStreamComponent *self, PaAlsaHostApiRepresentation *alsaApi,
        const PaStreamParameters *params, StreamDirection streamDir, int callbackMode )
{
    PaError result = paNoError;
    PaSampleFormat userSampleFormat = params->sampleFormat, hostSampleFormat = paNoError;
    assert( params->channelCount > 0 );

    /* Make sure things have an initial value */
    memset( self, 0, sizeof (PaAlsaStreamComponent) );

    if( NULL == params->hostApiSpecificStreamInfo )
    {
        const PaAlsaDeviceInfo *devInfo = GetDeviceInfo( &alsaApi->baseHostApiRep, params->device );
        self->numHostChannels = PA_MAX( params->channelCount, StreamDirection_In == streamDir ? devInfo->minInputChannels
                : devInfo->minOutputChannels );
        self->deviceIsPlug = devInfo->isPlug;
        PA_DEBUG(( "%s: Host Chans %c %i\n", __FUNCTION__, streamDir == StreamDirection_In ? 'C' : 'P', self->numHostChannels ));
    }
    else
    {
        /* We're blissfully unaware of the minimum channelCount */
        self->numHostChannels = params->channelCount;
        /* Check if device name does not start with hw: to determine if it is a 'plug' device */
        if( strncmp( "hw:", ((PaAlsaStreamInfo *)params->hostApiSpecificStreamInfo)->deviceString, 3 ) != 0  )
            self->deviceIsPlug = 1; /* An Alsa plug device, not a direct hw device */
    }
    if( self->deviceIsPlug && alsaApi->alsaLibVersion < ALSA_VERSION_INT( 1, 0, 16 ) )
        self->useReventFix = 1; /* Prior to Alsa1.0.16, plug devices may stutter without this fix */

    self->device = params->device;

    PA_ENSURE( AlsaOpen( &alsaApi->baseHostApiRep, params, streamDir, &self->pcm ) );
    self->nfds = alsa_snd_pcm_poll_descriptors_count( self->pcm );

    PA_ENSURE( hostSampleFormat = PaUtil_SelectClosestAvailableFormat( GetAvailableFormats( self->pcm ), userSampleFormat ) );

    self->hostSampleFormat = hostSampleFormat;
    self->nativeFormat = Pa2AlsaFormat( hostSampleFormat );
    self->hostInterleaved = self->userInterleaved = !( userSampleFormat & paNonInterleaved );
    self->numUserChannels = params->channelCount;
    self->streamDir = streamDir;
    self->canMmap = 0;
    self->nonMmapBuffer = NULL;
    self->nonMmapBufferSize = 0;

    if( !callbackMode && !self->userInterleaved )
    {
        /* Pre-allocate non-interleaved user provided buffers */
        PA_UNLESS( self->userBuffers = PaUtil_AllocateMemory( sizeof (void *) * self->numUserChannels ),
                paInsufficientMemory );
    }

error:

    /* Log all available formats. */
    if ( hostSampleFormat == paSampleFormatNotSupported )
    {
        LogAllAvailableFormats( self->pcm );
        PA_DEBUG(( "%s: Please provide the log output to PortAudio developers, your hardware does not have any sample format implemented yet.\n", __FUNCTION__ ));
    }

    return result;
}